

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner_boundary.cpp
# Opt level: O2

void __thiscall duckdb::CSVBoundary::Print(CSVBoundary *this)

{
  ostream *poVar1;
  
  poVar1 = ::std::operator<<((ostream *)&::std::cout,"---Boundary: ");
  poVar1 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = ::std::operator<<(poVar1," ---");
  ::std::operator<<(poVar1,'\n');
  poVar1 = ::std::operator<<((ostream *)&::std::cout,"Buffer Index: ");
  poVar1 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  ::std::operator<<(poVar1,'\n');
  poVar1 = ::std::operator<<((ostream *)&::std::cout,"Buffer Pos: ");
  poVar1 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  ::std::operator<<(poVar1,'\n');
  poVar1 = ::std::operator<<((ostream *)&::std::cout,"End Pos: ");
  poVar1 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  ::std::operator<<(poVar1,'\n');
  poVar1 = ::std::operator<<((ostream *)&::std::cout,"------------");
  poVar1 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  ::std::operator<<(poVar1,'\n');
  return;
}

Assistant:

void CSVBoundary::Print() const {
#ifndef DUCKDB_DISABLE_PRINT
	std::cout << "---Boundary: " << boundary_idx << " ---" << '\n';
	std::cout << "Buffer Index: " << buffer_idx << '\n';
	std::cout << "Buffer Pos: " << buffer_pos << '\n';
	std::cout << "End Pos: " << end_pos << '\n';
	std::cout << "------------" << end_pos << '\n';
#endif
}